

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckASCII(TidyDocImpl *doc,Node *node)

{
  char cVar1;
  Node *pNVar2;
  tmbstr ptVar3;
  Bool BVar4;
  int iVar5;
  char *__haystack;
  AttVal *pAVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ctmbstr cp;
  char *pcVar11;
  bool bVar12;
  
  if (((doc->access).PRIORITYCHK - 4U < 0xfffffffd) ||
     (pNVar2 = node->content, pNVar2 == (Node *)0x0)) {
LAB_00155449:
    bVar12 = false;
  }
  else {
    uVar8 = pNVar2->start;
    if (pNVar2->end <= uVar8 + 1) goto LAB_00155449;
    ptVar3 = doc->lexer->lexbuf;
    uVar7 = (ulong)(uVar8 + 1);
    iVar5 = -1;
    do {
      cVar1 = ptVar3[uVar7];
      uVar9 = uVar8 + 6;
      uVar8 = (uint)uVar7;
      if (uVar7 < uVar9) {
        lVar10 = 0;
        do {
          if (ptVar3[lVar10 + (uVar7 & 0xffffffff)] != cVar1) goto LAB_001553a9;
          lVar10 = lVar10 + 1;
        } while ((int)lVar10 != 5);
        lVar10 = 5;
LAB_001553a9:
        bVar12 = 4 < (uint)lVar10;
      }
      else {
        bVar12 = false;
      }
      iVar5 = iVar5 + (uint)(cVar1 == '\n');
    } while ((!bVar12) && (uVar7 = uVar7 + 1, pNVar2->end != (uint)uVar7));
    if ((bool)(iVar5 < 6 & (bVar12 ^ 1U))) goto LAB_00155449;
    bVar12 = true;
    if (((node->prev != (Node *)0x0) && (pNVar2 = node->prev->prev, pNVar2 != (Node *)0x0)) &&
       (pAVar6 = pNVar2->attributes, pAVar6 != (AttVal *)0x0)) {
      __haystack = (char *)0x0;
      iVar5 = 0;
      do {
        if (((pAVar6->dict != (Attribute *)0x0) && (pAVar6->dict->id == TidyAttr_HREF)) &&
           (pcVar11 = pAVar6->value, pcVar11 != (char *)0x0)) {
          do {
            if (*pcVar11 == '\0') goto LAB_0015543e;
            BVar4 = prvTidyIsWhite((int)*pcVar11);
            pcVar11 = pcVar11 + 1;
          } while (BVar4 != no);
          __haystack = pAVar6->value;
          iVar5 = iVar5 + 1;
        }
LAB_0015543e:
        bVar12 = true;
        pAVar6 = pAVar6->next;
      } while (pAVar6 != (AttVal *)0x0);
      goto LAB_00155450;
    }
  }
  iVar5 = 0;
  __haystack = (char *)0x0;
LAB_00155450:
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    if (iVar5 == 1) {
      pNVar2 = node->next;
      iVar5 = 1;
      if (((pNVar2 != (Node *)0x0) && (pNVar2->tag != (Dict *)0x0)) &&
         ((pNVar2->tag->id == TidyTag_A && (pAVar6 = pNVar2->attributes, pAVar6 != (AttVal *)0x0))))
      {
        iVar5 = 1;
        do {
          if (((pAVar6->dict != (Attribute *)0x0) && (pAVar6->dict->id == TidyAttr_NAME)) &&
             (pcVar11 = pAVar6->value, pcVar11 != (char *)0x0)) {
            do {
              if (*pcVar11 == '\0') goto LAB_001554ec;
              BVar4 = prvTidyIsWhite((int)*pcVar11);
              pcVar11 = pcVar11 + 1;
            } while (BVar4 != no);
            pcVar11 = strstr(__haystack,pAVar6->value);
            iVar5 = (iVar5 + 1) - (uint)(pcVar11 == (char *)0x0);
          }
LAB_001554ec:
          pAVar6 = pAVar6->next;
        } while (pAVar6 != (AttVal *)0x0);
      }
    }
    if (((bVar12) && (prvTidyReportAccessError(doc,node,0x2a8), (doc->access).PRIORITYCHK == 3)) &&
       (iVar5 < 2)) {
      prvTidyReportAccessError(doc,node,0x30a);
      return;
    }
  }
  return;
}

Assistant:

static void CheckASCII( TidyDocImpl* doc, Node* node )
{
    Node* temp1;
    Node* temp2;

    tmbstr skipOver = NULL;
    Bool IsAscii = no;
    int HasSkipOverLink = 0;
        
    uint i, x;
    int newLines = -1;
    tmbchar compareLetter;
    int matchingCount = 0;
    AttVal* av;
    
    if (Level1_Enabled( doc ) && node->content)
    {
        /* 
           Checks the text within the PRE and XMP tags to see if ascii 
           art is present 
        */
        for (i = node->content->start + 1; i < node->content->end; i++)
        {
            matchingCount = 0;

            /* Counts the number of lines of text */
            if (doc->lexer->lexbuf[i] == '\n')
            {
                newLines++;
            }
            
            compareLetter = doc->lexer->lexbuf[i];

            /* Counts consecutive character matches */
            for (x = i; x < i + 5; x++)
            {
                if (doc->lexer->lexbuf[x] == compareLetter)
                {
                    matchingCount++;
                }

                else
                {
                    break;
                }
            }

            /* Must have at least 5 consecutive character matches */
            if (matchingCount >= 5)
            {
                break;
            }
        }

        /* 
           Must have more than 6 lines of text OR 5 or more consecutive 
           letters that are the same for there to be ascii art 
        */
        if (newLines >= 6 || matchingCount >= 5)
        {
            IsAscii = yes;
        }

        /* Checks for skip over link if ASCII art is present */
        if (IsAscii == yes)
        {
            if (node->prev != NULL && node->prev->prev != NULL)
            {
                temp1 = node->prev->prev;

                /* Checks for 'HREF' attribute */
                for (av = temp1->attributes; av != NULL; av = av->next)
                {
                    if ( attrIsHREF(av) && hasValue(av) )
                    {
                        skipOver = av->value;
                        HasSkipOverLink++;
                    }
                }
            }
        }
    }

    if (Level2_Enabled( doc ))
    {
        /* 
           Checks for A element following PRE to ensure proper skipover link
           only if there is an A element preceding PRE.
        */
        if (HasSkipOverLink == 1)
        {
            if ( nodeIsA(node->next) )
            {
                temp2 = node->next;
                
                /* Checks for 'NAME' attribute */
                for (av = temp2->attributes; av != NULL; av = av->next)
                {
                    if ( attrIsNAME(av) && hasValue(av) )
                    {
                        /* 
                           Value within the 'HREF' attribute must be the same
                           as the value within the 'NAME' attribute for valid
                           skipover.
                        */
                        if ( strstr(skipOver, av->value) != NULL )
                        {
                            HasSkipOverLink++;
                        }
                    }
                }
            }
        }

        if (IsAscii == yes)
        {
            TY_(ReportAccessError)( doc, node, ASCII_REQUIRES_DESCRIPTION);
            if (Level3_Enabled( doc ) && (HasSkipOverLink < 2))
                TY_(ReportAccessError)( doc, node, SKIPOVER_ASCII_ART);
        }

    }
}